

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldst_helper.c
# Opt level: O2

uint64_t helper_ld_asi_sparc(CPUSPARCState *env,target_ulong_conflict addr,int asi,uint32_t memop)

{
  AddressSpace *as;
  uc_struct_conflict12 *uc;
  target_ulong_conflict tVar1;
  uint64_t uVar2;
  uint uVar3;
  ulong addr_00;
  uint uVar4;
  int iVar5;
  uintptr_t unaff_retaddr;
  uintptr_t in_stack_ffffffffffffffb8;
  MemTxResult result;
  CPUState *local_38;
  
  uVar3 = memop & 3;
  iVar5 = 1 << (sbyte)uVar3;
  local_38 = (CPUState *)(env[-0xd].regbase + 0x26);
  do_check_align(env,addr,iVar5 - 1,unaff_retaddr);
  switch(asi) {
  case 2:
    if ((addr < 0xd) && ((0x1101U >> (addr & 0x1f) & 1) != 0)) {
      uVar2 = 0;
      if ((uVar3 == 2) && (uVar2 = 0, ((env->def).features & 0x10000) != 0)) {
        if (addr == 8) {
          uVar2 = 0x18220000;
        }
        else if (addr == 4) {
          uVar2 = 0x10220000;
        }
        else if (addr == 0) {
          uVar2 = (uint64_t)env->cache_control;
        }
        else {
          uVar2 = 0;
        }
      }
      break;
    }
    if (addr == 0x1c00a00) {
      if (uVar3 == 3) {
LAB_008cb1da:
        uVar2 = env->mxccregs[3];
        break;
      }
    }
    else if (addr == 0x1c00a04) {
      if (uVar3 == 2) goto LAB_008cb1da;
    }
    else if (addr == 0x1c00c00) {
      if (uVar3 == 3) {
        uVar2 = env->mxccregs[5];
        break;
      }
    }
    else if ((addr == 0x1c00f00) && (uVar3 == 3)) {
      uVar2 = env->mxccregs[7];
      break;
    }
    goto switchD_008caef1_caseD_5;
  case 3:
  case 0x18:
    uVar3 = addr >> 8 & 0xf;
    if (uVar3 < 5) {
      tVar1 = mmu_probe_sparc(env,addr,uVar3);
      uVar2 = (uint64_t)tVar1;
      break;
    }
    goto switchD_008caef1_caseD_5;
  case 4:
  case 0x19:
    uVar4 = addr >> 8 & 0x1f;
    if (uVar4 == 0x14) {
      uVar3 = env->mmuregs[4];
    }
    else if (uVar4 == 0x13) {
      uVar3 = env->mmuregs[3];
    }
    else {
      uVar3 = env->mmuregs[uVar4];
      if (uVar4 == 3) {
        env->mmuregs[3] = 0;
      }
    }
    goto LAB_008cb112;
  case 5:
  case 6:
  case 7:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x39:
    goto switchD_008caef1_caseD_5;
  case 8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x1a:
  case 0x1b:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
    goto switchD_008caef1_caseD_8;
  case 9:
    if (iVar5 == 8) {
      uVar2 = cpu_ldq_code_sparc(env,addr);
      break;
    }
    if (iVar5 == 2) {
      uVar3 = cpu_lduw_code_sparc(env,addr);
    }
    else if (iVar5 == 1) {
      uVar3 = cpu_ldub_code_sparc(env,addr);
    }
    else {
      uVar3 = cpu_ldl_code_sparc(env,addr);
    }
LAB_008cb112:
    uVar2 = (ulong)uVar3;
    break;
  case 10:
  case 0xb:
  case 0x1c:
  case 0x20:
switchD_008caef1_caseD_a:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/ldst_helper.c"
               ,0x32f,(char *)0x0);
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    addr_00 = CONCAT44(asi,addr) & 0xfffffffff;
    as = *(AddressSpace **)(env[-0xd].regbase + 0x6c);
    uc = as->uc;
    if (iVar5 == 8) {
      uVar2 = address_space_ldq_sparc((uc_struct_conflict8 *)uc,as,addr_00,(MemTxAttrs)0x1,&result);
    }
    else {
      if (iVar5 == 2) {
        uVar3 = address_space_lduw_sparc
                          ((uc_struct_conflict8 *)uc,as,addr_00,(MemTxAttrs)0x1,&result);
      }
      else if (iVar5 == 1) {
        uVar3 = address_space_ldub_sparc
                          ((uc_struct_conflict8 *)uc,as,addr_00,(MemTxAttrs)0x1,&result);
      }
      else {
        uVar3 = address_space_ldl_sparc
                          ((uc_struct_conflict8 *)uc,as,addr_00,(MemTxAttrs)0x1,&result);
      }
      uVar2 = (uint64_t)uVar3;
    }
    if (result != 0) {
      sparc_raise_mmu_fault
                (local_38,addr_00,false,false,0,(uint)unaff_retaddr,in_stack_ffffffffffffffb8);
    }
    break;
  case 0x38:
    switch(addr >> 8 & 3) {
    case 0:
      uVar2 = env->mmubpregs[0];
      break;
    case 1:
      uVar2 = env->mmubpregs[1];
      break;
    case 2:
      uVar2 = env->mmubpregs[2];
      break;
    case 3:
      uVar2 = env->mmubpregs[3];
      env->mmubpregs[3] = 0;
    }
    break;
  case 0x49:
    uVar2 = (uint64_t)env->mmubpctrv;
    break;
  case 0x4a:
    uVar2 = (uint64_t)env->mmubpctrc;
    break;
  case 0x4b:
    uVar2 = (uint64_t)env->mmubpctrs;
    break;
  case 0x4c:
    uVar2 = env->mmubpaction;
    break;
  default:
    if (asi == 0x80) goto switchD_008caef1_caseD_a;
    goto switchD_008caef1_caseD_8;
  }
LAB_008cb0c8:
  if ((memop & 4) != 0) {
    if (iVar5 == 4) {
      uVar2 = (uint64_t)(int)uVar2;
    }
    else if (iVar5 == 2) {
      uVar2 = (uint64_t)(short)uVar2;
    }
    else if (iVar5 == 1) {
      uVar2 = (uint64_t)(char)uVar2;
    }
  }
  return uVar2;
switchD_008caef1_caseD_8:
  sparc_raise_mmu_fault
            (local_38,(ulong)addr,false,false,asi,(uint)unaff_retaddr,in_stack_ffffffffffffffb8);
switchD_008caef1_caseD_5:
  uVar2 = 0;
  goto LAB_008cb0c8;
}

Assistant:

uint64_t helper_ld_asi(CPUSPARCState *env, target_ulong addr,
                       int asi, uint32_t memop)
{
    int size = 1 << (memop & MO_SIZE);
    int sign = memop & MO_SIGN;
    CPUState *cs = env_cpu(env);
    uint64_t ret = 0;
#if defined(DEBUG_MXCC) || defined(DEBUG_ASI)
    uint32_t last_addr = addr;
#endif

    do_check_align(env, addr, size - 1, GETPC());
    switch (asi) {
    case ASI_M_MXCC: /* SuperSparc MXCC registers, or... */
    /* case ASI_LEON_CACHEREGS:  Leon3 cache control */
        switch (addr) {
        case 0x00:          /* Leon3 Cache Control */
        case 0x08:          /* Leon3 Instruction Cache config */
        case 0x0C:          /* Leon3 Date Cache config */
            if (env->def.features & CPU_FEATURE_CACHE_CTRL) {
                ret = leon3_cache_control_ld(env, addr, size);
            }
            break;
        case 0x01c00a00: /* MXCC control register */
            if (size == 8) {
                ret = env->mxccregs[3];
            } else {
                qemu_log_mask(LOG_UNIMP,
                              "%08x: unimplemented access size: %d\n", addr,
                              size);
            }
            break;
        case 0x01c00a04: /* MXCC control register */
            if (size == 4) {
                ret = env->mxccregs[3];
            } else {
                qemu_log_mask(LOG_UNIMP,
                              "%08x: unimplemented access size: %d\n", addr,
                              size);
            }
            break;
        case 0x01c00c00: /* Module reset register */
            if (size == 8) {
                ret = env->mxccregs[5];
                /* should we do something here? */
            } else {
                qemu_log_mask(LOG_UNIMP,
                              "%08x: unimplemented access size: %d\n", addr,
                              size);
            }
            break;
        case 0x01c00f00: /* MBus port address register */
            if (size == 8) {
                ret = env->mxccregs[7];
            } else {
                qemu_log_mask(LOG_UNIMP,
                              "%08x: unimplemented access size: %d\n", addr,
                              size);
            }
            break;
        default:
            qemu_log_mask(LOG_UNIMP,
                          "%08x: unimplemented address, size: %d\n", addr,
                          size);
            break;
        }
        DPRINTF_MXCC("asi = %d, size = %d, sign = %d, "
                     "addr = %08x -> ret = %" PRIx64 ","
                     "addr = %08x\n", asi, size, sign, last_addr, ret, addr);
#ifdef DEBUG_MXCC
        dump_mxcc(env);
#endif
        break;
    case ASI_M_FLUSH_PROBE: /* SuperSparc MMU probe */
    case ASI_LEON_MMUFLUSH: /* LEON3 MMU probe */
        {
            int mmulev;

            mmulev = (addr >> 8) & 15;
            if (mmulev > 4) {
                ret = 0;
            } else {
                ret = mmu_probe(env, addr, mmulev);
            }
            DPRINTF_MMU("mmu_probe: 0x%08x (lev %d) -> 0x%08" PRIx64 "\n",
                        addr, mmulev, ret);
        }
        break;
    case ASI_M_MMUREGS: /* SuperSparc MMU regs */
    case ASI_LEON_MMUREGS: /* LEON3 MMU regs */
        {
            int reg = (addr >> 8) & 0x1f;

            ret = env->mmuregs[reg];
            if (reg == 3) { /* Fault status cleared on read */
                env->mmuregs[3] = 0;
            } else if (reg == 0x13) { /* Fault status read */
                ret = env->mmuregs[3];
            } else if (reg == 0x14) { /* Fault address read */
                ret = env->mmuregs[4];
            }
            DPRINTF_MMU("mmu_read: reg[%d] = 0x%08" PRIx64 "\n", reg, ret);
        }
        break;
    case ASI_M_TLBDIAG: /* Turbosparc ITLB Diagnostic */
    case ASI_M_DIAGS:   /* Turbosparc DTLB Diagnostic */
    case ASI_M_IODIAG:  /* Turbosparc IOTLB Diagnostic */
        break;
    case ASI_KERNELTXT: /* Supervisor code access */
        switch (size) {
        case 1:
            ret = cpu_ldub_code(env, addr);
            break;
        case 2:
            ret = cpu_lduw_code(env, addr);
            break;
        default:
        case 4:
            ret = cpu_ldl_code(env, addr);
            break;
        case 8:
            ret = cpu_ldq_code(env, addr);
            break;
        }
        break;
    case ASI_M_TXTC_TAG:   /* SparcStation 5 I-cache tag */
    case ASI_M_TXTC_DATA:  /* SparcStation 5 I-cache data */
    case ASI_M_DATAC_TAG:  /* SparcStation 5 D-cache tag */
    case ASI_M_DATAC_DATA: /* SparcStation 5 D-cache data */
        break;
    case 0x21: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x22: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x23: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x24: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x25: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x26: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x27: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x28: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x29: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x2a: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x2b: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x2c: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x2d: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x2e: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x2f: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    {
        MemTxResult result;
        hwaddr access_addr = (hwaddr)addr | ((hwaddr)(asi & 0xf) << 32);

        switch (size) {
        case 1:
            ret = glue(address_space_ldub, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, access_addr,
                                     MEMTXATTRS_UNSPECIFIED, &result);
            break;
        case 2:
            ret = glue(address_space_lduw, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, access_addr,
                                     MEMTXATTRS_UNSPECIFIED, &result);
            break;
        default:
        case 4:
            ret = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, access_addr,
                                    MEMTXATTRS_UNSPECIFIED, &result);
            break;
        case 8:
            ret = glue(address_space_ldq, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, access_addr,
                                    MEMTXATTRS_UNSPECIFIED, &result);
            break;
        }

        if (result != MEMTX_OK) {
            sparc_raise_mmu_fault(cs, access_addr, false, false, false,
                                  size, GETPC());
        }
        break;
    }
    case 0x30: /* Turbosparc secondary cache diagnostic */
    case 0x31: /* Turbosparc RAM snoop */
    case 0x32: /* Turbosparc page table descriptor diagnostic */
    case 0x39: /* data cache diagnostic register */
        ret = 0;
        break;
    case 0x38: /* SuperSPARC MMU Breakpoint Control Registers */
        {
            int reg = (addr >> 8) & 3;

            switch (reg) {
            case 0: /* Breakpoint Value (Addr) */
                ret = env->mmubpregs[reg];
                break;
            case 1: /* Breakpoint Mask */
                ret = env->mmubpregs[reg];
                break;
            case 2: /* Breakpoint Control */
                ret = env->mmubpregs[reg];
                break;
            case 3: /* Breakpoint Status */
                ret = env->mmubpregs[reg];
                env->mmubpregs[reg] = 0ULL;
                break;
            }
            DPRINTF_MMU("read breakpoint reg[%d] 0x%016" PRIx64 "\n", reg,
                        ret);
        }
        break;
    case 0x49: /* SuperSPARC MMU Counter Breakpoint Value */
        ret = env->mmubpctrv;
        break;
    case 0x4a: /* SuperSPARC MMU Counter Breakpoint Control */
        ret = env->mmubpctrc;
        break;
    case 0x4b: /* SuperSPARC MMU Counter Breakpoint Status */
        ret = env->mmubpctrs;
        break;
    case 0x4c: /* SuperSPARC MMU Breakpoint Action */
        ret = env->mmubpaction;
        break;
    case ASI_USERTXT: /* User code access, XXX */
    default:
        sparc_raise_mmu_fault(cs, addr, false, false, asi, size, GETPC());
        ret = 0;
        break;

    case ASI_USERDATA: /* User data access */
    case ASI_KERNELDATA: /* Supervisor data access */
    case ASI_P: /* Implicit primary context data access (v9 only?) */
    case ASI_M_BYPASS:    /* MMU passthrough */
    case ASI_LEON_BYPASS: /* LEON MMU passthrough */
        /* These are always handled inline.  */
        g_assert_not_reached();
    }
    if (sign) {
        switch (size) {
        case 1:
            ret = (int8_t) ret;
            break;
        case 2:
            ret = (int16_t) ret;
            break;
        case 4:
            ret = (int32_t) ret;
            break;
        default:
            break;
        }
    }
#ifdef DEBUG_ASI
    dump_asi("read ", last_addr, asi, size, ret);
#endif
    return ret;
}